

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

optional<unsigned_char> parseDec<unsigned_char>(string *str,size_type *n)

{
  char *__first;
  _Optional_payload_base<unsigned_char> _Var1;
  __integer_from_chars_result_type<unsigned_long> _Var2;
  uintmax_t value;
  unsigned_long local_18;
  
  local_18 = 0;
  __first = (str->_M_dataplus)._M_p;
  _Var2 = std::from_chars<unsigned_long>(__first,__first + str->_M_string_length,&local_18,10);
  if (_Var2.ec == 0) {
    *n = (size_type)(_Var2.ptr + (*n - (long)(str->_M_dataplus)._M_p));
    _Var1 = (_Optional_payload_base<unsigned_char>)((byte)local_18 | 0x100);
  }
  else {
    _Var1._M_payload = (_Storage<unsigned_char,_true>)0x0;
    _Var1._M_engaged = false;
  }
  return (_Optional_base<unsigned_char,_true,_true>)(_Optional_base<unsigned_char,_true,_true>)_Var1
  ;
}

Assistant:

static std::optional<U> parseDec(std::string const &str, std::string::size_type &n) {
	uintmax_t value = 0;
	auto result = std::from_chars(str.data(), str.data() + str.size(), value);
	if ((bool)result.ec) {
		return std::nullopt;
	}
	n += result.ptr - str.data();
	return std::optional<U>{value};
}